

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double beta_inc(double a,double b,double x)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  double __x;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (a <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
    pcVar5 = "  A <= 0.\n";
  }
  else {
    if (0.0 < b) {
      dVar7 = 0.0;
      if ((x <= 0.0) || (dVar7 = 1.0, 1.0 <= x)) {
        return dVar7;
      }
      dVar8 = a + b;
      dVar9 = dVar8 * x;
      dVar14 = 1.0;
      dVar7 = x;
      if (dVar9 <= a) {
        dVar7 = 1.0 - x;
      }
      uVar6 = -(ulong)(a < dVar9);
      __x = 1.0 - x;
      dVar13 = a;
      if (dVar9 <= a) {
        __x = x;
        dVar13 = b;
      }
      dVar15 = (double)(~uVar6 & (ulong)a | uVar6 & (ulong)b);
      iVar1 = (int)(dVar7 * dVar8 + dVar13);
      dVar9 = __x;
      if (iVar1 != 0) {
        dVar9 = __x / dVar7;
      }
      iVar3 = 1 - iVar1;
      iVar4 = 2;
      dVar10 = 1.0;
      dVar11 = dVar13 + -1.0;
      do {
        dVar10 = (dVar10 * dVar11 * dVar9) / ((double)(iVar4 + -1) + dVar15);
        dVar14 = dVar14 + dVar10;
        if ((ABS(dVar10) <= 1e-07) && (ABS(dVar10) <= dVar14 * 1e-07)) {
          dVar8 = log(__x);
          dVar7 = log(dVar7);
          dVar7 = exp(dVar7 * (dVar13 + -1.0) + dVar8 * dVar15);
          dVar8 = r8_beta(a,b);
          dVar7 = (dVar14 * dVar7) / (dVar8 * dVar15);
          return (double)((ulong)(1.0 - dVar7) & uVar6 | ~uVar6 & (ulong)dVar7);
        }
        if (iVar1 < 1) {
          dVar12 = dVar8 + 1.0;
          dVar11 = dVar8;
        }
        else {
          dVar11 = dVar13 - (double)iVar4;
          dVar12 = dVar8;
          if (iVar3 + iVar4 == 2) {
            dVar9 = __x;
          }
        }
        iVar4 = iVar4 + 1;
        iVar1 = iVar1 + -1;
        dVar8 = dVar12;
      } while (iVar4 != 0x3ea);
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  Maximum number of iterations exceeded!\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"  IT_MAX = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000);
      pcVar5 = "\n";
      goto LAB_00193069;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
    pcVar5 = "  B <= 0.\n";
  }
  poVar2 = (ostream *)&std::cerr;
LAB_00193069:
  std::operator<<(poVar2,pcVar5);
  exit(1);
}

Assistant:

double beta_inc ( double a, double b, double x )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_INC returns the value of the incomplete Beta function.
//
//  Discussion:
//
//    This calculation requires an iteration.  In some cases, the iteration
//    may not converge rapidly, or may become inaccurate.
//
//    BETA_INC(A,B,X)
//
//      =   Integral ( 0 <= T <= X ) T^(A-1) (1-T)^(B-1) dT
//        / Integral ( 0 <= T <= 1 ) T^(A-1) (1-T)^(B-1) dT
//
//      =   Integral ( 0 <= T <= X ) T^(A-1) (1-T)^(B-1) dT
//        / BETA(A,B)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Majumder, Bhattacharjee.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Majumder, Bhattacharjee,
//    Algorithm AS63,
//    Applied Statistics,
//    1973, volume 22, number 3.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the function.
//    0.0 < A,
//    0.0 < B.
//
//    Input, double X, the argument of the function.
//    Normally, 0.0 <= X <= 1.0.
//
//    Output, double BETA_INC, the value of the function.
//
{
  double cx;
  int i;
  int it;
  int it_max = 1000;
  bool indx;
  int ns;
  double pp;
  double psq;
  double qq;
  double rx;
  double temp;
  double term;
  double tol = 1.0E-07;
  double value;
  double xx;

  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_INC - Fatal error!\n";
    cerr << "  A <= 0.\n";
    exit ( 1 );
  }

  if ( b <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_INC - Fatal error!\n";
    cerr << "  B <= 0.\n";
    exit ( 1 );
  }

  if ( x <= 0.0 )
  {
    value = 0.0;
    return value;
  }
  else if ( 1.0 <= x )
  {
    value = 1.0;
    return value;
  }
//
//  Change tail if necessary and determine S.
//
  psq = a + b;

  if ( a < ( a + b ) * x )
  {
    xx = 1.0 - x;
    cx = x;
    pp = b;
    qq = a;
    indx = true;
  }
  else
  {
    xx = x;
    cx = 1.0 - x;
    pp = a;
    qq = b;
    indx = false;
  }

  term = 1.0;
  i = 1;
  value = 1.0;

  ns = static_cast<int>( qq + cx * ( a + b ) );
//
//  Use Soper's reduction formulas.
//
  rx = xx / cx;

  temp = qq - static_cast<double>(i);
  if ( ns == 0 )
  {
    rx = xx;
  }

  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    if ( it_max < it )
    {
      cerr << "\n";
      cerr << "BETA_INC - Fatal error!\n";
      cerr << "  Maximum number of iterations exceeded!\n";
      cerr << "  IT_MAX = " << it_max << "\n";
      exit ( 1 );
    }

    term = term * temp * rx / ( pp + static_cast<double>(i ) );
    value = value + term;
    temp = fabs ( term );

    if ( temp <= tol && temp <= tol * value )
    {
      break;
    }

    i = i + 1;
    ns = ns - 1;

    if ( 0 <= ns )
    {
      temp = qq - static_cast< double > ( i);
      if ( ns == 0 )
      {
        rx = xx;
      }
    }
    else
    {
      temp = psq;
      psq = psq + 1.0;
    }
  }
//
//  Finish calculation.
//
  value = value * exp ( pp * log ( xx )
    + ( qq - 1.0 ) * log ( cx ) ) / ( r8_beta ( a, b ) * pp );

  if ( indx )
  {
    value = 1.0 - value;
  }

  return value;
}